

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

Box * __thiscall amrex::BoxList::minimalBox(BoxList *this)

{
  bool bVar1;
  reference pBVar2;
  BoxList *in_RSI;
  Box *in_RDI;
  Box *minbox;
  const_iterator End;
  const_iterator bli;
  BoxList *in_stack_ffffffffffffff38;
  Box *this_00;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_a8;
  Box *local_a0;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_98;
  uint local_8c;
  int local_88 [2];
  int local_80;
  IntVect local_74;
  int local_68 [2];
  int local_60;
  IntVect local_58 [2];
  int local_40 [2];
  int local_38;
  IntVect local_2c;
  int local_20 [2];
  int local_18;
  IntVect local_c;
  
  this_00 = in_RDI;
  IntVect::IntVect(&local_2c,1);
  local_38 = local_2c.vect[2];
  local_40[0] = local_2c.vect[0];
  local_40[1] = local_2c.vect[1];
  local_60 = local_2c.vect[2];
  local_68[0] = local_2c.vect[0];
  local_68[1] = local_2c.vect[1];
  local_58[0].vect[2] = local_2c.vect[2];
  local_58[0].vect[0] = local_2c.vect[0];
  local_58[0].vect[1] = local_2c.vect[1];
  IntVect::IntVect(&local_c,0);
  local_18 = local_c.vect[2];
  local_20[0] = local_c.vect[0];
  local_20[1] = local_c.vect[1];
  local_80 = local_c.vect[2];
  local_88[0] = local_c.vect[0];
  local_88[1] = local_c.vect[1];
  local_74.vect[0] = local_c.vect[0];
  local_74.vect[1] = local_c.vect[1];
  local_74.vect[2] = local_c.vect[2];
  local_8c = (uint)ixType(in_RSI);
  Box::Box(this_00,local_58,&local_74,(IndexType)local_8c);
  bVar1 = isEmpty((BoxList *)0xfac527);
  if (!bVar1) {
    local_98._M_current = (Box *)begin(in_stack_ffffffffffffff38);
    local_a0 = (Box *)end(in_stack_ffffffffffffff38);
    pBVar2 = __gnu_cxx::
             __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
             ::operator*(&local_98);
    *(undefined8 *)(this_00->smallend).vect = *(undefined8 *)(pBVar2->smallend).vect;
    *(undefined8 *)((this_00->smallend).vect + 2) = *(undefined8 *)((pBVar2->smallend).vect + 2);
    *(undefined8 *)((this_00->bigend).vect + 1) = *(undefined8 *)((pBVar2->bigend).vect + 1);
    (this_00->btype).itype = (pBVar2->btype).itype;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                 ::operator++(this_00,(int)((ulong)in_RDI >> 0x20));
      pBVar2 = __gnu_cxx::
               __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
               ::operator*(&local_a8);
      Box::minBox(this_00,pBVar2);
    }
  }
  return in_RDI;
}

Assistant:

Box
BoxList::minimalBox () const
{
    Box minbox(IntVect::TheUnitVector(), IntVect::TheZeroVector(), ixType());
    if ( !isEmpty() )
    {
        const_iterator bli = begin(), End = end();
        minbox = *bli;
        while ( bli != End )
        {
            minbox.minBox(*bli++);
        }
    }
    return minbox;
}